

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteRedundantCasts.cpp
# Opt level: O1

Expr * __thiscall RedundantCastsVisitor::simplify(RedundantCastsVisitor *this,Expr *expr)

{
  bool bVar1;
  Expr *pEVar2;
  Expr *expr_00;
  Expr *pEVar3;
  
  if (expr == (Expr *)0x0) {
    pEVar3 = (Expr *)0x0;
  }
  else {
    bVar1 = CastExpr::classof(expr);
    pEVar3 = (Expr *)0x0;
    if (bVar1) {
      pEVar3 = expr;
    }
  }
  if (pEVar3 != (Expr *)0x0) {
    expr_00 = *(Expr **)&pEVar3[1].kind;
    while( true ) {
      if (expr_00 == (Expr *)0x0) {
        pEVar2 = (Expr *)0x0;
      }
      else {
        bVar1 = CastExpr::classof(expr_00);
        pEVar2 = (Expr *)0x0;
        if (bVar1) {
          pEVar2 = expr_00;
        }
      }
      if (pEVar2 == (Expr *)0x0) break;
      expr_00 = *(Expr **)&pEVar2[1].kind;
    }
    *(Expr **)&pEVar3[1].kind = expr_00;
  }
  return expr;
}

Assistant:

Expr* RedundantCastsVisitor::simplify(Expr* expr) {
    if (auto* cast = llvm::dyn_cast_or_null<CastExpr>(expr)) {
        Expr* innermost = cast->expr;

        while (auto* inner = llvm::dyn_cast_or_null<CastExpr>(innermost)) {
            innermost = inner->expr;
        }

        cast->expr = innermost;
    }

    return expr;
}